

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall QFutureInterfaceBase::reportFinished(QFutureInterfaceBase *this)

{
  QFutureInterfaceBasePrivate *this_00;
  long in_FS_OFFSET;
  QFutureCallOutEvent local_60;
  undefined1 local_28 [24];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,&this->d->m_mutex);
  if (((this->d->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i & 4U) == 0) {
    switch_from_to(&this->d->state,1,4);
    QWaitCondition::wakeAll(&this->d->waitCondition);
    this_00 = this->d;
    QFutureCallOutEvent::QFutureCallOutEvent(&local_60,Finished,-1);
    QFutureInterfaceBasePrivate::sendCallOut(this_00,&local_60);
    QFutureCallOutEvent::~QFutureCallOutEvent(&local_60);
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::reportFinished()
{
    QMutexLocker locker(&d->m_mutex);
    if (!isFinished()) {
        switch_from_to(d->state, Running, Finished);
        d->waitCondition.wakeAll();
        d->sendCallOut(QFutureCallOutEvent(QFutureCallOutEvent::Finished));
    }
}